

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cpp
# Opt level: O0

void __thiscall Edge::Edge(Edge *this,int id)

{
  int id_local;
  Edge *this_local;
  
  this->id = id;
  this->nextEdge = (Edge *)0x0;
  this->origin = (Vertex *)0x0;
  this->destiny = (Vertex *)0x0;
  this->closed = false;
  this->activePowerFlow = 0.0;
  this->reactivePowerFlow = 0.0;
  this->resistance = 0.0;
  this->reactance = 0.0;
  this->activeLoss = 0.0;
  this->reactiveLoss = 0.0;
  this->modifiable = true;
  this->marked = true;
  this->fixed = false;
  return;
}

Assistant:

Edge::Edge(int id){

    this->id = id;

    this->nextEdge          = NULL;
    this->origin            = NULL;
    this->destiny           = NULL;

    this->closed            = false;

    this->activePowerFlow   = 0.0;
    this->reactivePowerFlow = 0.0;
    this->resistance        = 0.0;
    this->reactance         = 0.0;
    this->activeLoss        = 0.0;
    this->reactiveLoss      = 0.0;

    this->modifiable = true;
    this->marked = true;
    this->fixed = false;
}